

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall MIDIStreamer::Precache(MIDIStreamer *this)

{
  MIDIDevice *pMVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  unsigned_short *puVar6;
  ushort local_26a;
  int local_268;
  int j;
  ushort local_256;
  uint local_254;
  undefined1 local_250 [2];
  WORD packnum;
  int i;
  TArray<unsigned_short,_unsigned_short> packed;
  int data2;
  int data1;
  int channel;
  int command;
  DWORD *event;
  DWORD *event_end;
  char local_218 [7];
  bool multiple_banks;
  BYTE found_banks [256];
  BYTE found_instruments [256];
  MIDIStreamer *this_local;
  
  memset(found_banks + 0xf8,0,0x100);
  memset(local_218,0,0x100);
  bVar2 = false;
  this->LoopLimit = 1;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])();
  local_218[0] = '\x01';
  found_banks[0x78] = '\x01';
  while (iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(), (((byte)iVar3 ^ 0xff) & 1) != 0) {
    iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                      (this,this->Events,this->Events + 1,600000000);
    _channel = this->Events;
    while (_channel < (undefined1 *)CONCAT44(extraout_var,iVar3)) {
      if ((*_channel)[2] >> 0x18 == 0) {
        uVar5 = (*_channel)[2] & 0x70;
        uVar4 = (*_channel)[2] & 0xf;
        packed.Count = (*_channel)[2] >> 8 & 0x7f;
        packed.Most = (*_channel)[2] >> 0x10 & 0x7f;
        if ((uVar4 == 9) || (uVar5 != 0x40)) {
          if ((uVar4 == 9) && ((uVar5 == 0x40 && (packed.Count != 0)))) {
            bVar2 = true;
            local_218[(int)(packed.Count | 0x80)] = '\x01';
          }
          else if ((uVar4 == 9) && ((uVar5 == 0x10 && (packed.Most != 0)))) {
            found_banks[(long)(int)(packed.Count | 0x80) + 0xf8] = '\x01';
          }
          else if ((uVar5 == 0x30) && ((packed.Count == 0 && (packed.Most != 0)))) {
            bVar2 = true;
            if (uVar4 == 9) {
              local_218[(int)(packed.Most | 0x80)] = '\x01';
            }
            else {
              local_218[(int)packed.Most] = '\x01';
            }
          }
        }
        else {
          found_banks[(long)(int)packed.Count + 0xf8] = '\x01';
        }
      }
      if ((*_channel)[2] < 0x80000000) {
        _channel = (DWORD (*) [384])(*_channel + 3);
      }
      else {
        _channel = (DWORD (*) [384])(*_channel + ((((*_channel)[2] & 0xffffff) + 3 >> 2) + 3));
      }
    }
  }
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])();
  TArray<unsigned_short,_unsigned_short>::TArray
            ((TArray<unsigned_short,_unsigned_short> *)local_250);
  for (local_254 = 0; (int)local_254 < 0x100; local_254 = local_254 + 1) {
    if (found_banks[(long)(int)local_254 + 0xf8] != '\0') {
      local_256 = (ushort)local_254 & 0x7f | (ushort)((local_254 & 0x80) << 7);
      if (bVar2) {
        for (local_268 = 0; local_268 < 0x80; local_268 = local_268 + 1) {
          if (local_218[(int)(local_268 + (local_254 & 0x80))] != '\0') {
            local_26a = local_256 | (ushort)(local_268 << 7);
            TArray<unsigned_short,_unsigned_short>::Push
                      ((TArray<unsigned_short,_unsigned_short> *)local_250,&local_26a);
          }
        }
      }
      else {
        TArray<unsigned_short,_unsigned_short>::Push
                  ((TArray<unsigned_short,_unsigned_short> *)local_250,&local_256);
      }
    }
  }
  pMVar1 = this->MIDI;
  puVar6 = TArray<unsigned_short,_unsigned_short>::operator[]
                     ((TArray<unsigned_short,_unsigned_short> *)local_250,0);
  uVar5 = TArray<unsigned_short,_unsigned_short>::Size
                    ((TArray<unsigned_short,_unsigned_short> *)local_250);
  (*pMVar1->_vptr_MIDIDevice[0x11])(pMVar1,puVar6,(ulong)uVar5);
  TArray<unsigned_short,_unsigned_short>::~TArray
            ((TArray<unsigned_short,_unsigned_short> *)local_250);
  return;
}

Assistant:

void MIDIStreamer::Precache()
{
	BYTE found_instruments[256] = { 0, };
	BYTE found_banks[256] = { 0, };
	bool multiple_banks = false;

	LoopLimit = 1;
	DoRestart();
	found_banks[0] = true;		// Bank 0 is always used.
	found_banks[128] = true;

	// Simulate playback to pick out used instruments.
	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				int command = (event[2] & 0x70);
				int channel = (event[2] & 0x0f);
				int data1 = (event[2] >> 8) & 0x7f;
				int data2 = (event[2] >> 16) & 0x7f;

				if (channel != 9 && command == (MIDI_PRGMCHANGE & 0x70))
				{
					found_instruments[data1] = true;
				}
				else if (channel == 9 && command == (MIDI_PRGMCHANGE & 0x70) && data1 != 0)
				{ // On a percussion channel, program change also serves as bank select.
					multiple_banks = true;
					found_banks[data1 | 128] = true;
				}
				else if (channel == 9 && command == (MIDI_NOTEON & 0x70) && data2 != 0)
				{
					found_instruments[data1 | 128] = true;
				}
				else if (command == (MIDI_CTRLCHANGE & 0x70) && data1 == 0 && data2 != 0)
				{
					multiple_banks = true;
					if (channel == 9)
					{
						found_banks[data2 | 128] = true;
					}
					else
					{
						found_banks[data2] = true;
					}
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}
	DoRestart();

	// Now pack everything into a contiguous region for the PrecacheInstruments call().
	TArray<WORD> packed;

	for (int i = 0; i < 256; ++i)
	{
		if (found_instruments[i])
		{
			WORD packnum = (i & 127) | ((i & 128) << 7);
			if (!multiple_banks)
			{
				packed.Push(packnum);
			}
			else
			{ // In order to avoid having to multiplex tracks in a type 1 file,
			  // precache every used instrument in every used bank, even if not
			  // all combinations are actually used.
				for (int j = 0; j < 128; ++j)
				{
					if (found_banks[j + (i & 128)])
					{
						packed.Push(packnum | (j << 7));
					}
				}
			}
		}
	}
	MIDI->PrecacheInstruments(&packed[0], packed.Size());
}